

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O0

void __thiscall bandit::reporter::info::summary(info *this)

{
  ostream *poVar1;
  void *pvVar2;
  size_type sVar3;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [48];
  string local_30 [32];
  info *local_10;
  info *this_local;
  
  poVar1 = (this->super_colored_base).stm_;
  local_10 = this;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[6])();
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1,"Tests run: ");
  pvVar2 = (void *)std::ostream::operator<<
                             (poVar1,(this->super_colored_base).super_progress_base.specs_run_);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  if (0 < (this->super_colored_base).super_progress_base.specs_skipped_) {
    poVar1 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[3])();
    poVar1 = std::operator<<(poVar1,local_60);
    poVar1 = std::operator<<(poVar1,"Skipped: ");
    pvVar2 = (void *)std::ostream::operator<<
                               (poVar1,(this->super_colored_base).super_progress_base.specs_skipped_
                               );
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_60);
  }
  if (0 < (this->super_colored_base).super_progress_base.specs_succeeded_) {
    poVar1 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[2])();
    poVar1 = std::operator<<(poVar1,local_80);
    poVar1 = std::operator<<(poVar1,"Passed: ");
    pvVar2 = (void *)std::ostream::operator<<
                               (poVar1,(this->super_colored_base).super_progress_base.
                                       specs_succeeded_);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_80);
  }
  if (0 < (this->super_colored_base).super_progress_base.specs_failed_) {
    poVar1 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[5])();
    poVar1 = std::operator<<(poVar1,local_a0);
    poVar1 = std::operator<<(poVar1,"Failed: ");
    pvVar2 = (void *)std::ostream::operator<<
                               (poVar1,(this->super_colored_base).super_progress_base.specs_failed_)
    ;
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_a0);
  }
  sVar3 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&(this->super_colored_base).super_progress_base.test_run_errors_);
  if (sVar3 != 0) {
    poVar1 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[5])();
    poVar1 = std::operator<<(poVar1,local_c0);
    poVar1 = std::operator<<(poVar1,"Errors: ");
    sVar3 = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->super_colored_base).super_progress_base.test_run_errors_);
    pvVar2 = (void *)std::ostream::operator<<(poVar1,sVar3);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_c0);
  }
  poVar1 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])();
  poVar1 = std::operator<<(poVar1,local_e0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_e0);
  return;
}

Assistant:

void summary() {
        stm_
            << colorizer_.emphasize()
            << "Tests run: " << specs_run_
            << std::endl;
        if (specs_skipped_ > 0) {
          stm_
              << colorizer_.neutral()
              << "Skipped: " << specs_skipped_
              << std::endl;
        }
        if (specs_succeeded_ > 0) {
          stm_
              << colorizer_.good()
              << "Passed: " << specs_succeeded_
              << std::endl;
        }
        if (specs_failed_ > 0) {
          stm_
              << colorizer_.bad()
              << "Failed: " << specs_failed_
              << std::endl;
        }
        if (test_run_errors_.size() > 0) {
          stm_
              << colorizer_.bad()
              << "Errors: " << test_run_errors_.size()
              << std::endl;
        }
        stm_
            << colorizer_.reset()
            << std::endl;
      }